

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O1

int isobusfs_recv_err(int sock,isobusfs_err_msg *emsg)

{
  __u32 __errnum;
  sock_extended_err *psVar1;
  isobusfs_stats *piVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  cmsghdr *__cmsg;
  uint __errnum_00;
  int iVar8;
  sock_extended_err *serr;
  char control [200];
  msghdr local_130;
  cmsghdr local_f8 [12];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = local_f8;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar4 = recvmsg(sock,&local_130,0x2040);
  if ((int)sVar4 == -1) {
    piVar5 = __errno_location();
    __errnum_00 = -*piVar5;
    pcVar6 = strerror(__errnum_00);
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: %i (%s)",(ulong)__errnum_00,pcVar6);
  }
  else if ((local_130.msg_flags & 8U) == 0) {
    emsg->serr = (sock_extended_err *)0x0;
    emsg->tss = (scm_timestamping *)0x0;
    __errnum_00 = 0;
    if ((cmsghdr *)local_130.msg_control != (cmsghdr *)0x0 && 0xf < local_130.msg_controllen) {
      __errnum_00 = 0;
      __cmsg = (cmsghdr *)local_130.msg_control;
      while (__cmsg->cmsg_len != 0) {
        iVar8 = __cmsg->cmsg_level;
        if (iVar8 == 0x6b) {
          if (__cmsg->cmsg_type == 4) {
            emsg->serr = (sock_extended_err *)(__cmsg + 1);
            goto LAB_0010183f;
          }
LAB_0010182d:
          warnx("serr: not supported type: %d.%d",iVar8,__cmsg->cmsg_type);
        }
        else {
          if (iVar8 != 1) goto LAB_0010182d;
          if (__cmsg->cmsg_type == 0x36) {
            iVar8 = (int)__cmsg->cmsg_len + -0x10;
            if (0 < iVar8) {
              piVar2 = emsg->stats;
              uVar7 = 0;
              do {
                if (*(short *)((long)&__cmsg[1].cmsg_len + uVar7 + 2) == 1) {
                  piVar2->send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar7 + 4);
                }
                else {
                  warnx("not supported J1939_NLA field\n");
                }
                uVar3 = (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar7) + 3 & 0xfffffffc) +
                        (int)uVar7;
                uVar7 = (ulong)uVar3;
              } while ((int)uVar3 < iVar8);
            }
          }
          else {
            if (__cmsg->cmsg_type != 0x25) goto LAB_0010182d;
            emsg->tss = (scm_timestamping *)(__cmsg + 1);
          }
        }
LAB_0010183f:
        psVar1 = emsg->serr;
        if ((psVar1 != (sock_extended_err *)0x0) && (emsg->tss != (scm_timestamping *)0x0)) {
          if (psVar1->ee_origin == '\x01') {
            if (psVar1->ee_info != 1) {
              warnx("serr: unknown ee_info: %i");
            }
            __errnum = psVar1->ee_errno;
            pcVar6 = strerror(__errnum);
            warnx("serr: tx error: %i, %s",__errnum,pcVar6);
            return psVar1->ee_errno;
          }
          if (psVar1->ee_origin == '\x04') {
            piVar2 = emsg->stats;
            if (psVar1->ee_errno != 0x2a) {
              warnx("serr: expected ENOMSG, got: %i");
            }
            (&piVar2->tskey_sch)[psVar1->ee_info != 1] = psVar1->ee_data;
            return (uint)(psVar1->ee_info != 1) * 4 + -4;
          }
          warnx("serr: wrong origin: %u");
          return 0;
        }
        __cmsg = __cmsg_nxthdr(&local_130,__cmsg);
        if (__cmsg == (cmsghdr *)0x0) {
          return 0;
        }
      }
    }
  }
  else {
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: truncated");
    __errnum_00 = 0xffffffea;
  }
  return __errnum_00;
}

Assistant:

int isobusfs_recv_err(int sock, struct isobusfs_err_msg *emsg)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(sock, &msg, MSG_ERRQUEUE | MSG_DONTWAIT);
	if (ret == -1) {
		ret = -errno;
		pr_err("recvmsg error notification: %i (%s)", ret, strerror(ret));
		return ret;
	}

	if (msg.msg_flags & MSG_CTRUNC) {
		pr_err("recvmsg error notification: truncated");
		return -EINVAL;
	}

	emsg->serr = NULL;
	emsg->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		isobusfs_parse_cm(emsg, cm);
		if (emsg->serr && emsg->tss)
			return isobusfs_extract_serr(emsg);
	}

	return 0;
}